

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

int bid_keyword(char *p,ssize_t len)

{
  int iVar1;
  int local_2c;
  int l;
  int i;
  char **keys;
  ssize_t len_local;
  char *p_local;
  
  switch(*p) {
  case 'c':
    _l = bid_keyword::keys_c;
    break;
  case 'd':
  case 'f':
    _l = bid_keyword::keys_df;
    break;
  default:
    return 0;
  case 'g':
    _l = bid_keyword::keys_g;
    break;
  case 'i':
  case 'l':
    _l = bid_keyword::keys_il;
    break;
  case 'm':
    _l = bid_keyword::keys_m;
    break;
  case 'n':
  case 'o':
    _l = bid_keyword::keys_no;
    break;
  case 'r':
    _l = bid_keyword::keys_r;
    break;
  case 's':
    _l = bid_keyword::keys_s;
    break;
  case 't':
    _l = bid_keyword::keys_t;
    break;
  case 'u':
    _l = bid_keyword::keys_u;
  }
  local_2c = 0;
  while( true ) {
    if (_l[local_2c] == (char *)0x0) {
      return 0;
    }
    iVar1 = bid_keycmp(p,_l[local_2c],len);
    if (0 < iVar1) break;
    local_2c = local_2c + 1;
  }
  return iVar1;
}

Assistant:

static int
bid_keyword(const char *p,  ssize_t len)
{
	static const char *keys_c[] = {
		"content", "contents", "cksum", NULL
	};
	static const char *keys_df[] = {
		"device", "flags", NULL
	};
	static const char *keys_g[] = {
		"gid", "gname", NULL
	};
	static const char *keys_il[] = {
		"ignore", "inode", "link", NULL
	};
	static const char *keys_m[] = {
		"md5", "md5digest", "mode", NULL
	};
	static const char *keys_no[] = {
		"nlink", "nochange", "optional", NULL
	};
	static const char *keys_r[] = {
		"resdevice", "rmd160", "rmd160digest", NULL
	};
	static const char *keys_s[] = {
		"sha1", "sha1digest",
		"sha256", "sha256digest",
		"sha384", "sha384digest",
		"sha512", "sha512digest",
		"size", NULL
	};
	static const char *keys_t[] = {
		"tags", "time", "type", NULL
	};
	static const char *keys_u[] = {
		"uid", "uname",	NULL
	};
	const char **keys;
	int i;

	switch (*p) {
	case 'c': keys = keys_c; break;
	case 'd': case 'f': keys = keys_df; break;
	case 'g': keys = keys_g; break;
	case 'i': case 'l': keys = keys_il; break;
	case 'm': keys = keys_m; break;
	case 'n': case 'o': keys = keys_no; break;
	case 'r': keys = keys_r; break;
	case 's': keys = keys_s; break;
	case 't': keys = keys_t; break;
	case 'u': keys = keys_u; break;
	default: return (0);/* Unknown key */
	}

	for (i = 0; keys[i] != NULL; i++) {
		int l = bid_keycmp(p, keys[i], len);
		if (l > 0)
			return (l);
	}
	return (0);/* Unknown key */
}